

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_dft.hpp
# Opt level: O1

bool __thiscall SlidingDFT<double,_64UL>::update(SlidingDFT<double,_64UL> *this,double new_x)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  long lVar8;
  complex<double> local_48;
  double local_30;
  double local_28;
  
  dVar2 = this->x[this->x_index];
  this->x[this->x_index] = new_x;
  dVar3 = this->damping_factor;
  dVar6 = pow(dVar3,64.0);
  lVar8 = 0x618;
  do {
    local_28 = *(double *)((long)this->x + lVar8 + -8) * dVar3;
    local_30 = (*(double *)((long)this->x + lVar8 + -0x10) * dVar3 - dVar6 * dVar2) + new_x;
    puVar1 = (undefined8 *)((long)this + lVar8 + -0x408);
    local_48._M_value._0_8_ = *puVar1;
    local_48._M_value._8_8_ = puVar1[1];
    std::complex<double>::operator*=(&local_48,(complex<double> *)&local_30);
    puVar1 = (undefined8 *)((long)this->x + lVar8 + -0x10);
    *puVar1 = local_48._M_value._0_8_;
    puVar1[1] = local_48._M_value._8_8_;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0xa18);
  dVar2 = *(double *)this->S[0]._M_value;
  dVar3 = *(double *)(this->S[0]._M_value + 8);
  dVar6 = *(double *)this->S[0x3f]._M_value;
  dVar4 = *(double *)(this->S[0x3f]._M_value + 8);
  dVar5 = *(double *)(this->S[1]._M_value + 8);
  *(double *)this->dft[0]._M_value = dVar2 * 0.5 - (*(double *)this->S[1]._M_value + dVar6) * 0.25;
  *(double *)(this->dft[0]._M_value + 8) = dVar3 * 0.5 - (dVar4 + dVar5) * 0.25;
  lVar8 = 0x610;
  do {
    dVar3 = *(double *)((long)this->x + lVar8 + 0x10);
    dVar4 = *(double *)((long)this->x + lVar8);
    dVar5 = *(double *)((long)this->x + lVar8 + 0x20);
    *(double *)(this->twiddle[0x20]._M_value + lVar8) =
         *(double *)((long)this->x + lVar8 + 8) * 0.5 -
         (*(double *)((long)this->x + lVar8 + -8) + *(double *)((long)this->x + lVar8 + 0x18)) *
         0.25;
    *(double *)(this->twiddle[0x20]._M_value + lVar8 + 8) = dVar3 * 0.5 - (dVar4 + dVar5) * 0.25;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x9f0);
  dVar3 = *(double *)(this->S[0x3f]._M_value + 8);
  dVar4 = *(double *)(this->S[0x3e]._M_value + 8);
  dVar5 = *(double *)(this->S[0]._M_value + 8);
  *(double *)this->dft[0x3f]._M_value =
       dVar6 * 0.5 - (dVar2 + *(double *)this->S[0x3e]._M_value) * 0.25;
  *(double *)(this->dft[0x3f]._M_value + 8) = dVar3 * 0.5 - (dVar4 + dVar5) * 0.25;
  uVar7 = this->x_index + 1;
  this->x_index = uVar7;
  if (0x3f < uVar7) {
    this->data_valid = true;
    this->x_index = 0;
  }
  return this->data_valid;
}

Assistant:

bool update(NumberFormat new_x)
	{
		// Update the storage of the time domain values
		const NumberFormat old_x = this->x[this->x_index];
		this->x[this->x_index] = new_x;

		// Update the DFT
		const NumberFormat r = this->damping_factor;
		const NumberFormat r_to_N = pow(r, (NumberFormat)DFT_Length);
		for (size_t k = 0; k < DFT_Length; k++) {
			this->S[k] = this->twiddle[k] * (r * this->S[k] - r_to_N * old_x + new_x);
		}

		// Apply the Hanning window
		this->dft[0] = (NumberFormat)0.5*this->S[0] - (NumberFormat)0.25*(this->S[DFT_Length - 1] + this->S[1]);
		for (size_t k = 1; k < (DFT_Length - 1); k++) {
			this->dft[k] = (NumberFormat)0.5*this->S[k] - (NumberFormat)0.25*(this->S[k - 1] + this->S[k + 1]);
		}
		this->dft[DFT_Length - 1] = (NumberFormat)0.5*this->S[DFT_Length - 1] - (NumberFormat)0.25*(this->S[DFT_Length - 2] + this->S[0]);

		// Increment the counter
		this->x_index++;
		if (this->x_index >= DFT_Length) {
			this->data_valid = true;
			this->x_index = 0;
		}

		// Done.
		return this->data_valid;
	}